

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestMain.cpp
# Opt level: O2

void Test::printHelp(string *progName)

{
  _Rb_tree_header *p_Var1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  ostream *poVar3;
  _Rb_tree_node_base *p_Var4;
  char *pcVar5;
  SuiteEntry *entry;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__args_1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Test::SuiteEntry,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Test::SuiteEntry>_>_>
  sortedSuites;
  
  poVar3 = std::operator<<((ostream *)&std::cout,
                           "Runs the test-suites. The list of all available test-suites can be found beneath. Passing no argument runs all suites marked with \'(default)\'."
                          );
  std::endl<char,std::char_traits<char>>(poVar3);
  poVar3 = std::operator<<((ostream *)&std::cout,"Run with \'");
  poVar3 = std::operator<<(poVar3,(string *)progName);
  poVar3 = std::operator<<(poVar3," [options]\'");
  std::endl<char,std::char_traits<char>>(poVar3);
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  *(undefined8 *)(std::__exception_ptr::exception_ptr::exception_ptr + *(long *)(std::cout + -0x18))
       = 0x1e;
  poVar3 = std::operator<<((ostream *)&std::cout,"--help");
  *(undefined8 *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x10) = 4;
  poVar3 = std::operator<<(poVar3," ");
  poVar3 = std::operator<<(poVar3,"Prints this help");
  std::endl<char,std::char_traits<char>>(poVar3);
  *(undefined8 *)(std::__exception_ptr::exception_ptr::exception_ptr + *(long *)(std::cout + -0x18))
       = 0x1e;
  poVar3 = std::operator<<((ostream *)&std::cout,"--list-tests[=<file>]");
  *(undefined8 *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x10) = 4;
  poVar3 = std::operator<<(poVar3," ");
  poVar3 = std::operator<<(poVar3,
                           "Prints the list of test methods to the given output file or the standard output. Does not actually run any tests"
                          );
  std::endl<char,std::char_traits<char>>(poVar3);
  *(undefined8 *)(std::__exception_ptr::exception_ptr::exception_ptr + *(long *)(std::cout + -0x18))
       = 0x1e;
  poVar3 = std::operator<<((ostream *)&std::cout,"--test-pattern=<pattern>");
  *(undefined8 *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x10) = 4;
  poVar3 = std::operator<<(poVar3," ");
  poVar3 = std::operator<<(poVar3,
                           "Runs only the test methods matching the given simplified glob pattern. Only full matches and wildcard (via \'*\') matching is supported."
                          );
  std::endl<char,std::char_traits<char>>(poVar3);
  *(undefined8 *)(std::__exception_ptr::exception_ptr::exception_ptr + *(long *)(std::cout + -0x18))
       = 0x1e;
  poVar3 = std::operator<<((ostream *)&std::cout," ");
  *(undefined8 *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x10) = 4;
  poVar3 = std::operator<<(poVar3," ");
  poVar3 = std::operator<<(poVar3,
                           "Can be repeated to include test-methods matching any of the given patterns."
                          );
  std::endl<char,std::char_traits<char>>(poVar3);
  *(undefined8 *)(std::__exception_ptr::exception_ptr::exception_ptr + *(long *)(std::cout + -0x18))
       = 0x1e;
  poVar3 = std::operator<<((ostream *)&std::cout,"--output=val");
  *(undefined8 *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x10) = 4;
  poVar3 = std::operator<<(poVar3," ");
  poVar3 = std::operator<<(poVar3,
                           "Sets the output of the tests. Available options are: plain, colored, gcc, msvc, generic, junit. Defaults to \'plain\'"
                          );
  std::endl<char,std::char_traits<char>>(poVar3);
  *(undefined8 *)(std::__exception_ptr::exception_ptr::exception_ptr + *(long *)(std::cout + -0x18))
       = 0x1e;
  poVar3 = std::operator<<((ostream *)&std::cout,"-o=val");
  *(undefined8 *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x10) = 4;
  poVar3 = std::operator<<(poVar3," ");
  poVar3 = std::operator<<(poVar3,
                           "\'plain\' prints simple text, \'colored\' uses console colors, \'gcc\', \'msvc\' and \'generic\' use compiler-like output syntax"
                          );
  std::endl<char,std::char_traits<char>>(poVar3);
  *(undefined8 *)(std::__exception_ptr::exception_ptr::exception_ptr + *(long *)(std::cout + -0x18))
       = 0x1e;
  poVar3 = std::operator<<((ostream *)&std::cout,"--mode=val");
  *(undefined8 *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x10) = 4;
  poVar3 = std::operator<<(poVar3," ");
  poVar3 = std::operator<<(poVar3,
                           "Sets the output mode to one of \'debug\', \'verbose\', \'terse\' in order of the amount of information printed. Defaults to \'terse\'"
                          );
  std::endl<char,std::char_traits<char>>(poVar3);
  *(undefined8 *)(std::__exception_ptr::exception_ptr::exception_ptr + *(long *)(std::cout + -0x18))
       = 0x1e;
  poVar3 = std::operator<<((ostream *)&std::cout,"--output-file=file");
  *(undefined8 *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x10) = 4;
  poVar3 = std::operator<<(poVar3," ");
  poVar3 = std::operator<<(poVar3,
                           "Sets the optional output file to write to, defaults to \'stdout\'. \'colored\' output can only write to console!"
                          );
  std::endl<char,std::char_traits<char>>(poVar3);
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  poVar3 = std::operator<<((ostream *)&std::cout,"Test suites:");
  std::endl<char,std::char_traits<char>>(poVar3);
  pbVar2 = DAT_0013a220;
  p_Var1 = &sortedSuites._M_t._M_impl.super__Rb_tree_header;
  sortedSuites._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  sortedSuites._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  sortedSuites._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  __args_1 = availableSuites;
  sortedSuites._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  sortedSuites._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  for (; p_Var4 = sortedSuites._M_t._M_impl.super__Rb_tree_header._M_header._M_left,
      __args_1 != pbVar2;
      __args_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &__args_1[3]._M_string_length) {
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,Test::SuiteEntry>,std::_Select1st<std::pair<std::__cxx11::string_const,Test::SuiteEntry>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,Test::SuiteEntry>>>
    ::_M_emplace_unique<std::__cxx11::string_const&,Test::SuiteEntry_const&>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,Test::SuiteEntry>,std::_Select1st<std::pair<std::__cxx11::string_const,Test::SuiteEntry>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,Test::SuiteEntry>>>
                *)&sortedSuites,__args_1,(SuiteEntry *)__args_1);
  }
  for (; (_Rb_tree_header *)p_Var4 != p_Var1;
      p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4)) {
    *(undefined8 *)
     (std::__exception_ptr::exception_ptr::exception_ptr + *(long *)(std::cout + -0x18)) = 0x1e;
    poVar3 = std::operator<<((ostream *)&std::cout,(string *)(p_Var4 + 1));
    *(undefined8 *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x10) = 4;
    poVar3 = std::operator<<(poVar3," ");
    poVar3 = std::operator<<(poVar3,(string *)(p_Var4 + 4));
    pcVar5 = "";
    if ((p_Var4[5]._M_color & _S_black) == _S_red) {
      pcVar5 = " (default)";
    }
    poVar3 = std::operator<<(poVar3,pcVar5);
    std::endl<char,std::char_traits<char>>(poVar3);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Test::SuiteEntry>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Test::SuiteEntry>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Test::SuiteEntry>_>_>
  ::~_Rb_tree(&sortedSuites._M_t);
  return;
}

Assistant:

void printHelp(const std::string &progName) {
    static const int paramWidth = 30;
    static const int gapWidth = 4;
    std::cout << "Runs the test-suites. The list of all available test-suites can be found beneath. Passing no "
                 "argument runs all suites marked with '(default)'."
              << std::endl;
    std::cout << "Run with '" << progName << " [options]'" << std::endl;
    std::cout << std::endl;
    std::cout << std::setw(paramWidth) << "--help" << std::setw(gapWidth) << " " << "Prints this help" << std::endl;
    std::cout << std::setw(paramWidth) << "--list-tests[=<file>]" << std::setw(gapWidth) << " "
              << "Prints the list of test methods to the given output file or the standard output. Does not actually "
                 "run any tests"
              << std::endl;
    std::cout << std::setw(paramWidth) << "--test-pattern=<pattern>" << std::setw(gapWidth) << " "
              << "Runs only the test methods matching the given simplified glob pattern. Only full matches and "
                 "wildcard (via '*') matching is supported."
              << std::endl;
    std::cout << std::setw(paramWidth) << " " << std::setw(gapWidth) << " "
              << "Can be repeated to include test-methods matching any of the given patterns." << std::endl;
    std::cout << std::setw(paramWidth) << "--output=val" << std::setw(gapWidth) << " "
              << "Sets the output of the tests. Available options are: plain, colored, gcc, msvc, generic, junit. "
                 "Defaults to 'plain'"
              << std::endl;
    std::cout << std::setw(paramWidth) << "-o=val" << std::setw(gapWidth) << " "
              << "'plain' prints simple text, 'colored' uses console colors, 'gcc', 'msvc' and 'generic' use "
                 "compiler-like output syntax"
              << std::endl;
    std::cout << std::setw(paramWidth) << "--mode=val" << std::setw(gapWidth) << " "
              << "Sets the output mode to one of 'debug', 'verbose', 'terse' in order of the amount of information "
                 "printed. Defaults to 'terse'"
              << std::endl;
    std::cout << std::setw(paramWidth) << "--output-file=file" << std::setw(gapWidth) << " "
              << "Sets the optional output file to write to, defaults to 'stdout'. 'colored' output can only write to "
                 "console!"
              << std::endl;
    std::cout << std::endl;
    std::cout << "Test suites:" << std::endl;
    // sort suites by name
    std::map<std::string, SuiteEntry> sortedSuites;
    for (const auto &entry : availableSuites)
      sortedSuites.emplace(entry.name, entry);
    for (const auto &pair : sortedSuites) {
      std::cout << std::setw(paramWidth) << pair.first << std::setw(gapWidth) << " " << pair.second.description
                << (pair.second.has(RegistrationFlags::OMIT_FROM_DEFAULT) ? "" : " (default)") << std::endl;
    }
  }